

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void nite::print(int64_t n)

{
  unsigned_long_long in_RDX;
  string local_30;
  
  toStr_abi_cxx11_(&local_30,(nite *)n,in_RDX);
  print(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void nite::print(Int64 n){
	nite::print(nite::toStr((long long unsigned int)n));
}